

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

bool __thiscall llvm::yaml::Scanner::unrollIndent(Scanner *this,int ToColumn)

{
  list_type *plVar1;
  iterator pcVar2;
  ilist_node_base<false> *piVar3;
  int iVar4;
  ilist_node_base<false> *piVar5;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined1 local_48 [16];
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *local_38;
  
  local_48[0] = 0;
  if ((this->FlowLevel == 0) && (ToColumn < this->Indent)) {
    local_38 = &(this->TokenQueue).super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>
    ;
    plVar1 = &(this->TokenQueue).List;
    do {
      pcVar2 = this->Current;
      piVar5 = (ilist_node_base<false> *)
               BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                         (local_38,0x48,(Align)0x4);
      piVar5->Prev = (ilist_node_base<false> *)0x0;
      piVar5->Next = (ilist_node_base<false> *)0x0;
      uStack_68 = SUB84(pcVar2,0);
      uStack_64 = (undefined4)((ulong)pcVar2 >> 0x20);
      *(undefined4 *)&piVar5[1].Prev = 8;
      *(undefined4 *)((long)&piVar5[1].Prev + 4) = uStack_6c;
      *(undefined4 *)&piVar5[1].Next = uStack_68;
      *(undefined4 *)((long)&piVar5[1].Next + 4) = uStack_64;
      piVar5[2].Prev = (ilist_node_base<false> *)0x1;
      piVar5[2].Next = (ilist_node_base<false> *)&piVar5[3].Next;
      std::__cxx11::string::_M_construct<char*>((string *)&piVar5[2].Next,local_48,local_48);
      piVar3 = (plVar1->Sentinel).
               super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
               .super_node_base_type.Prev;
      piVar5->Next = (ilist_node_base<false> *)plVar1;
      piVar5->Prev = piVar3;
      piVar3->Next = piVar5;
      (plVar1->Sentinel).
      super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
      .super_node_base_type.Prev = piVar5;
      iVar4 = SmallVectorImpl<int>::pop_back_val(&(this->Indents).super_SmallVectorImpl<int>);
      this->Indent = iVar4;
    } while (ToColumn < iVar4);
  }
  return true;
}

Assistant:

bool Scanner::unrollIndent(int ToColumn) {
  Token T;
  // Indentation is ignored in flow.
  if (FlowLevel != 0)
    return true;

  while (Indent > ToColumn) {
    T.Kind = Token::TK_BlockEnd;
    T.Range = StringRef(Current, 1);
    TokenQueue.push_back(T);
    Indent = Indents.pop_back_val();
  }

  return true;
}